

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::rem_anchor_ref(Tree *this,size_t node)

{
  NodeData *pNVar1;
  
  pNVar1 = _p(this,node);
  (pNVar1->m_key).anchor.str = (char *)0x0;
  (pNVar1->m_key).anchor.len = 0;
  pNVar1 = _p(this,node);
  (pNVar1->m_val).anchor.str = (char *)0x0;
  (pNVar1->m_val).anchor.len = 0;
  _rem_flags(this,node,0x3c0);
  return;
}

Assistant:

void rem_anchor_ref(size_t node) { _p(node)->m_key.anchor.clear(); _p(node)->m_val.anchor.clear(); _rem_flags(node, KEYANCH|VALANCH|KEYREF|VALREF); }